

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf2.c
# Opt level: O2

double time_op(int g_a,double *buf_,int chunk,int loop,int proc,int ndim,int op)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  undefined8 local_58;
  int lo [2];
  int ld;
  double local_40;
  double alpha;
  
  lo[0] = -1;
  lo[1] = -1;
  local_58 = -1;
  ld = -1;
  alpha = 1.0;
  NGA_Distribution(g_a,proc,lo,(int *)&local_58);
  if (ndim == 1) {
    iVar5 = chunk * chunk + -1;
  }
  else {
    iVar5 = chunk + -1;
    local_58 = (ulong)(uint)(lo[1] + iVar5) << 0x20;
    ld = chunk;
  }
  local_58 = CONCAT44(local_58._4_4_,iVar5 + lo[0]);
  bVar1 = false;
  local_40 = armci_timer();
  iVar5 = 0;
  if (0 < loop) {
    iVar5 = loop;
  }
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    if (op == 2) {
      NGA_Acc(g_a,lo,(int *)&local_58,buf_,&ld,&alpha);
    }
    else if (op == 1) {
      NGA_Put(g_a,lo,(int *)&local_58,buf_,&ld);
    }
    else {
      NGA_Get(g_a,lo,(int *)&local_58,buf_,&ld);
    }
    if (bVar1) {
      lo[1] = lo[1] + -0x80;
      lo[0] = lo[0] + -0x80;
      iVar2 = (int)local_58 + -0x80;
      lVar4 = -0x400;
      iVar3 = -0x80;
    }
    else {
      iVar3 = 0x80;
      lo[1] = lo[1] + 0x80;
      lo[0] = lo[0] + 0x80;
      iVar2 = (int)local_58 + 0x80;
      lVar4 = 0x400;
    }
    bVar1 = !bVar1;
    local_58 = CONCAT44(local_58._4_4_ + iVar3,iVar2);
    buf_ = (double *)((long)buf_ + lVar4);
  }
  dVar7 = armci_timer();
  dVar7 = dVar7 - local_40;
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    warn_accuracy = warn_accuracy + 1;
    dVar7 = 1e-06;
  }
  return dVar7 / (double)loop;
}

Assistant:

double time_op(int g_a, double *buf_, int chunk, int loop, int proc,
               int ndim, int op)
{
  double start_time = 0;
  double stop_time = 0;
  double total_time = 0;
  int lo[2] = {-1,-1};
  int hi[2] = {-1,-1};
  int ld = -1;
  int i = 0;
  int bal = 0;
  double *buf = buf_;
  double alpha = 1;

  /* get the location within the g_a for the given proc */
  NGA_Distribution(g_a, proc, lo, hi);
  /* determine how much data to grab based on the chunk and dimensionality */
  if (ndim == 1) {
    hi[0] = lo[0] + chunk*chunk - 1;
  }
  else if (ndim == 2) {
    hi[0] = lo[0] + chunk - 1;
    hi[1] = lo[1] + chunk - 1;
    ld = chunk;
  }
  else {
    GA_Error("invalid ndim for time_op", ndim);
  }

  start_time = TIMER();
  for (i=0; i<loop; ++i) {
    switch (op) {
      case OP_GET:
        NGA_Get(g_a, lo, hi, buf, &ld);
        break;
      case OP_PUT:
        NGA_Put(g_a, lo, hi, buf, &ld);
        break;
      case OP_ACC:
        NGA_Acc(g_a, lo, hi, buf, &ld, &alpha);
        break;
      default:
        GA_Error("bad case value for op", op);
    }
    /* prepare next src location and dst ptr: avoid cache locality */
    if (bal == 0) {
      lo[0] += 128;
      lo[1] += 128;
      hi[0] += 128;
      hi[1] += 128;
      buf += 128;
      bal = 1;
    }
    else {
      lo[0] -= 128;
      lo[1] -= 128;
      hi[0] -= 128;
      hi[1] -= 128;
      buf -= 128;
      bal = 0;
    }
  }
  stop_time = TIMER();
  total_time = (stop_time - start_time);
  if (total_time == 0.0) {
    total_time = 0.000001; /* workaround for inaccurate timers */
    warn_accuracy++;
  }

  return(total_time / loop);
}